

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclHash.c
# Opt level: O0

Tcl_HashEntry * Tcl_NextHashEntry(Tcl_HashSearch *searchPtr)

{
  Tcl_HashEntry *pTVar1;
  Tcl_HashEntry *hPtr;
  Tcl_HashSearch *searchPtr_local;
  
  while( true ) {
    if (searchPtr->nextEntryPtr != (Tcl_HashEntry *)0x0) {
      pTVar1 = searchPtr->nextEntryPtr;
      searchPtr->nextEntryPtr = pTVar1->nextPtr;
      return pTVar1;
    }
    if (searchPtr->tablePtr->numBuckets <= searchPtr->nextIndex) break;
    searchPtr->nextEntryPtr = searchPtr->tablePtr->buckets[searchPtr->nextIndex];
    searchPtr->nextIndex = searchPtr->nextIndex + 1;
  }
  return (Tcl_HashEntry *)0x0;
}

Assistant:

Tcl_HashEntry *
Tcl_NextHashEntry(register Tcl_HashSearch *searchPtr)
{
    Tcl_HashEntry *hPtr;

    while (searchPtr->nextEntryPtr == NULL) {
	if (searchPtr->nextIndex >= searchPtr->tablePtr->numBuckets) {
	    return NULL;
	}
	searchPtr->nextEntryPtr =
	    searchPtr->tablePtr->buckets[searchPtr->nextIndex];
	searchPtr->nextIndex++;
    }
    hPtr = searchPtr->nextEntryPtr;
    searchPtr->nextEntryPtr = hPtr->nextPtr;
    return hPtr;
}